

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

ZPOS64_T unzGetOffset64(unzFile file)

{
  unz64_s *s;
  unzFile file_local;
  
  if (file == (unzFile)0x0) {
    file_local = (unzFile)0x0;
  }
  else if (*(long *)((long)file + 0x90) == 0) {
    file_local = (unzFile)0x0;
  }
  else if (((*(long *)((long)file + 0x68) == 0) || (*(long *)((long)file + 0x68) == 0xffff)) ||
          (*(long *)((long)file + 0x80) != *(long *)((long)file + 0x68))) {
    file_local = *(unzFile *)((long)file + 0x88);
  }
  else {
    file_local = (unzFile)0x0;
  }
  return (ZPOS64_T)file_local;
}

Assistant:

extern ZPOS64_T ZEXPORT unzGetOffset64(unzFile file)
{
    unz64_s* s;

    if (file == NULL)
        return 0; //UNZ_PARAMERROR;
    s = (unz64_s*)file;
    if (!s->current_file_ok)
        return 0;
    if (s->gi.number_entry != 0 && s->gi.number_entry != 0xffff)
        if (s->num_file == s->gi.number_entry)
            return 0;
    return s->pos_in_central_dir;
}